

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

Result wabt::ReadAll(FILE *stream,char *name,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  FILE *__stream;
  int iVar1;
  size_t __n;
  int *piVar2;
  char *pcVar3;
  size_type sVar4;
  uchar *puVar5;
  size_t old_size;
  size_t bytes_read;
  uint8_t buffer [4096];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  char *name_local;
  FILE *stream_local;
  
  buffer._4088_8_ = out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0);
  while( true ) {
    __n = fread(&bytes_read,1,0x1000,(FILE *)stream);
    if (__n == 0) break;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer._4088_8_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer._4088_8_,sVar4 + __n)
    ;
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer._4088_8_);
    memcpy(puVar5 + sVar4,&bytes_read,__n);
  }
  iVar1 = ferror((FILE *)stream);
  __stream = _stderr;
  if (iVar1 == 0) {
    Result::Result((Result *)((long)&stream_local + 4),Ok);
  }
  else {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"error reading from %s: %s\n",name,pcVar3);
    Result::Result((Result *)((long)&stream_local + 4),Error);
  }
  return (Result)stream_local._4_4_;
}

Assistant:

static Result ReadAll(FILE* stream,
                      const char* name,
                      std::vector<uint8_t>* out_data) {
  out_data->resize(0);
  uint8_t buffer[4096];
  while (true) {
    size_t bytes_read = fread(buffer, 1, sizeof(buffer), stream);
    if (bytes_read == 0) {
      if (ferror(stream)) {
        fprintf(stderr, "error reading from %s: %s\n", name, strerror(errno));
        return Result::Error;
      }
      return Result::Ok;
    }
    size_t old_size = out_data->size();
    out_data->resize(old_size + bytes_read);
    memcpy(out_data->data() + old_size, buffer, bytes_read);
  }
}